

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLcode Curl_multi_xfer_ulbuf_borrow(Curl_easy *data,char **pbuf,size_t *pbuflen)

{
  char *pcVar1;
  size_t *pbuflen_local;
  char **pbuf_local;
  Curl_easy *data_local;
  
  *pbuf = (char *)0x0;
  *pbuflen = 0;
  if (data->multi == (Curl_multi *)0x0) {
    Curl_failf(data,"transfer has no multi handle");
    data_local._4_4_ = CURLE_FAILED_INIT;
  }
  else if ((data->set).upload_buffer_size == 0) {
    Curl_failf(data,"transfer upload buffer size is 0");
    data_local._4_4_ = CURLE_FAILED_INIT;
  }
  else if (((byte)data->multi->field_0x271 >> 6 & 1) == 0) {
    if ((data->multi->xfer_ulbuf != (char *)0x0) &&
       (data->multi->xfer_ulbuf_len < (ulong)(data->set).upload_buffer_size)) {
      (*Curl_cfree)(data->multi->xfer_ulbuf);
      data->multi->xfer_ulbuf = (char *)0x0;
      data->multi->xfer_ulbuf_len = 0;
    }
    if (data->multi->xfer_ulbuf == (char *)0x0) {
      pcVar1 = (char *)(*Curl_cmalloc)((size_t)(data->set).upload_buffer_size);
      data->multi->xfer_ulbuf = pcVar1;
      if (data->multi->xfer_ulbuf == (char *)0x0) {
        Curl_failf(data,"could not allocate xfer_ulbuf of %zu bytes",
                   (ulong)(data->set).upload_buffer_size);
        return CURLE_OUT_OF_MEMORY;
      }
      data->multi->xfer_ulbuf_len = (ulong)(data->set).upload_buffer_size;
    }
    data->multi->field_0x271 = data->multi->field_0x271 & 0xbf | 0x40;
    *pbuf = data->multi->xfer_ulbuf;
    *pbuflen = data->multi->xfer_ulbuf_len;
    data_local._4_4_ = CURLE_OK;
  }
  else {
    Curl_failf(data,"attempt to borrow xfer_ulbuf when already borrowed");
    data_local._4_4_ = CURLE_AGAIN;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_multi_xfer_ulbuf_borrow(struct Curl_easy *data,
                                      char **pbuf, size_t *pbuflen)
{
  DEBUGASSERT(data);
  DEBUGASSERT(data->multi);
  *pbuf = NULL;
  *pbuflen = 0;
  if(!data->multi) {
    failf(data, "transfer has no multi handle");
    return CURLE_FAILED_INIT;
  }
  if(!data->set.upload_buffer_size) {
    failf(data, "transfer upload buffer size is 0");
    return CURLE_FAILED_INIT;
  }
  if(data->multi->xfer_ulbuf_borrowed) {
    failf(data, "attempt to borrow xfer_ulbuf when already borrowed");
    return CURLE_AGAIN;
  }

  if(data->multi->xfer_ulbuf &&
     data->set.upload_buffer_size > data->multi->xfer_ulbuf_len) {
    /* not large enough, get a new one */
    free(data->multi->xfer_ulbuf);
    data->multi->xfer_ulbuf = NULL;
    data->multi->xfer_ulbuf_len = 0;
  }

  if(!data->multi->xfer_ulbuf) {
    data->multi->xfer_ulbuf = malloc((size_t)data->set.upload_buffer_size);
    if(!data->multi->xfer_ulbuf) {
      failf(data, "could not allocate xfer_ulbuf of %zu bytes",
            (size_t)data->set.upload_buffer_size);
      return CURLE_OUT_OF_MEMORY;
    }
    data->multi->xfer_ulbuf_len = data->set.upload_buffer_size;
  }

  data->multi->xfer_ulbuf_borrowed = TRUE;
  *pbuf = data->multi->xfer_ulbuf;
  *pbuflen = data->multi->xfer_ulbuf_len;
  return CURLE_OK;
}